

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Gym_Emu.cpp
# Opt level: O1

int __thiscall
Gym_Emu::play_frame(Gym_Emu *this,blip_time_t blip_time,int sample_count,sample_t_conflict1 *buf)

{
  if ((this->super_Music_Emu).track_ended_ == false) {
    parse_frame(this);
  }
  Sms_Apu::end_frame(&this->apu,blip_time);
  memset(buf,0,(long)sample_count * 2);
  Ym2612_Emu::run(&this->fm,sample_count >> 1,buf);
  return sample_count;
}

Assistant:

int Gym_Emu::play_frame( blip_time_t blip_time, int sample_count, sample_t* buf )
{
	if ( !track_ended() )
		parse_frame();
	
	apu.end_frame( blip_time );
	
	memset( buf, 0, sample_count * sizeof *buf );
	fm.run( sample_count >> 1, buf );
	
	return sample_count;
}